

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::iterator::eraseNode
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint32_t uVar3;
  FreeNode *pFVar4;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *pIVar5;
  undefined8 uVar6;
  FreeNode *pFVar7;
  uint32_t end;
  uint uVar8;
  uint level_00;
  pointer pEVar9;
  ulong uVar10;
  
  level_00 = level - 1;
  if (level_00 == 0) {
    pIVar5 = (this->super_const_iterator).map;
    pEVar9 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar8 = pEVar9->offset;
    uVar3 = pIVar5->rootSize;
    if (uVar3 != uVar8 + 1) {
      do {
        uVar10 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        *(undefined8 *)((long)&pIVar5->field_0 + uVar10 * 8) =
             *(undefined8 *)((long)&pIVar5->field_0 + (ulong)uVar8 * 8);
        puVar1 = (undefined8 *)((long)&pIVar5->field_0 + (ulong)uVar8 * 0x10 + 0x28);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pIVar5->field_0 + uVar10 * 0x10 + 0x28);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
      } while (uVar3 - 1 != uVar8);
      pEVar9 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      uVar8 = pIVar5->rootSize - 1;
    }
    pIVar5->rootSize = uVar8;
    pEVar9->size = uVar8;
    if (uVar8 == 0) {
      *(undefined8 *)
       ((long)(pIVar5->field_0).rootLeaf.
              super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
              .second + 0x1c) = 0;
      *(undefined8 *)
       ((long)(pIVar5->field_0).rootLeaf.
              super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
              .second + 0x24) = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .second[2] = (Expression *)0x0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .second[3] = (Expression *)0x0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .second[0] = (Expression *)0x0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .second[1] = (Expression *)0x0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[4].left = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[4].right = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[3].left = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[3].right = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[2].left = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[2].right = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[1].left = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[1].right = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[0].left = 0;
      (pIVar5->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
      .first[0].right = 0;
      const_iterator::setRoot(&this->super_const_iterator,0);
      return;
    }
  }
  else {
    pEVar9 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    pFVar4 = (FreeNode *)pEVar9[level_00].node;
    uVar3 = pEVar9[level_00].size;
    if (uVar3 == 1) {
      pFVar4->next = alloc->freeList;
      alloc->freeList = pFVar4;
      eraseNode(this,level_00,alloc);
    }
    else {
      uVar8 = pEVar9[level_00].offset;
      if (uVar3 != uVar8 + 1) {
        do {
          uVar10 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          pFVar4[uVar10].next = pFVar4[uVar8].next;
          pFVar7 = (pFVar4 + (ulong)uVar8 * 2 + 8)[1].next;
          pFVar4[uVar10 * 2 + 8].next = pFVar4[(ulong)uVar8 * 2 + 8].next;
          (pFVar4 + uVar10 * 2 + 8)[1].next = pFVar7;
        } while (uVar3 - 1 != uVar8);
        pEVar9 = (this->super_const_iterator).path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      }
      pEVar9[level_00].size = uVar3 - 1;
      *(ulong *)((long)pEVar9[level - 2].node + (ulong)pEVar9[level - 2].offset * 8) =
           *(ulong *)((long)pEVar9[level - 2].node + (ulong)pEVar9[level - 2].offset * 8) &
           0xffffffffffffffc0 | (ulong)(uVar3 - 2);
      recomputeBounds(this,level_00);
    }
  }
  if (((this->super_const_iterator).path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0) &&
     (pEVar9 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar9->offset < pEVar9->size)) {
    uVar10 = *(ulong *)((long)pEVar9[level_00].node + (ulong)pEVar9[level_00].offset * 8);
    pEVar9[level].node = (void *)(uVar10 & 0xffffffffffffffc0);
    pEVar9[level].size = ((uint)uVar10 & 0x3f) + 1;
    (this->super_const_iterator).path.path.
    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[level].offset = 0;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::eraseNode(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    auto& map = *this->map;
    auto& path = this->path;

    if (--level == 0) {
        uint32_t offset = path.offset(0);
        map.rootBranch.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        if (map.empty()) {
            map.switchToLeaf();
            this->setRoot(0);
            return;
        }
    }
    else {
        auto& parent = path.template node<Branch>(level);
        if (path.size(level) == 1) {
            // Branch node became empty, remove it recursively.
            alloc.destroy(&parent);
            eraseNode(level, alloc);
        }
        else {
            // N.B. see note about updating parent bounds in erase()
            uint32_t offset = path.offset(level);
            uint32_t size = path.size(level);
            parent.erase(offset, offset + 1, size);
            path.setSize(level, size - 1);
            recomputeBounds(level);
        }
    }

    if (path.valid()) {
        path.reset(level + 1);
        path.offset(level + 1) = 0;
    }
}